

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O2

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetNormalIfPlanar
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  bool bVar1;
  string *result;
  ulong uVar2;
  Point *pPVar3;
  ulong uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Optional<webrtc::CartesianPoint<float>_> OVar5;
  Point PVar6;
  Point local_1d8;
  float local_1cc;
  undefined1 local_1c8 [16];
  Point local_1b8;
  undefined1 local_1a8 [376];
  
  local_1a8._0_8_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(array_geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_1d8.c[0] = 1.4013e-45;
  result = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                     ((unsigned_long *)local_1a8,(uint *)&local_1d8,"array_geometry.size() > 1u");
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x4c,result);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)local_1a8);
  }
  pPVar3 = (array_geometry->
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  PVar6 = PairDirection(pPVar3,pPVar3 + 1);
  local_1a8._8_4_ = PVar6.c[2];
  local_1a8._0_8_ = PVar6.c._0_8_;
  local_1d8.c[0] = 0.0;
  local_1d8.c[1] = 0.0;
  local_1d8.c[2] = 0.0;
  uVar2 = ((long)(array_geometry->
                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0xc;
  bVar1 = true;
  pPVar3 = pPVar3 + 1;
  uVar4 = 1;
  while( true ) {
    if ((uVar2 <= uVar4 + 1) || (bVar1 == false)) break;
    PVar6 = PairDirection(pPVar3,pPVar3 + 1);
    local_1d8.c[2] = PVar6.c[2];
    local_1d8.c._0_8_ = PVar6.c._0_8_;
    bVar1 = AreParallel((Point *)local_1a8,&local_1d8);
    pPVar3 = pPVar3 + 1;
    uVar4 = uVar4 + 1;
  }
  if (bVar1 == false) {
    PVar6 = CrossProduct((Point *)local_1a8,&local_1d8);
    local_1cc = PVar6.c[2];
    local_1b8.c._0_8_ = PVar6.c._0_8_;
    local_1c8._8_4_ = extraout_XMM0_Dc;
    local_1c8._0_4_ = local_1b8.c[0];
    local_1c8._4_4_ = local_1b8.c[1];
    local_1c8._12_4_ = extraout_XMM0_Dd;
    local_1b8.c[2] = local_1cc;
    do {
      uVar4 = uVar4 + 1;
      if (uVar2 <= uVar4) {
        uVar4 = (ulong)(uint)local_1cc | 0x100000000;
        goto LAB_001784f0;
      }
      PVar6 = PairDirection(pPVar3,pPVar3 + 1);
      local_1d8.c[2] = PVar6.c[2];
      local_1d8.c._0_8_ = PVar6.c._0_8_;
      bVar1 = ArePerpendicular(&local_1b8,&local_1d8);
      pPVar3 = pPVar3 + 1;
    } while (bVar1);
  }
  local_1c8._0_4_ = 0;
  local_1c8._4_4_ = 0;
  uVar4 = 0;
LAB_001784f0:
  OVar5.value_.c[1] = (float)local_1c8._4_4_;
  OVar5.value_.c[0] = (float)local_1c8._0_4_;
  OVar5.value_.c[2] = (float)(int)uVar4;
  OVar5.has_value_ = (bool)(char)(uVar4 >> 0x20);
  OVar5._13_3_ = (int3)(uVar4 >> 0x28);
  return OVar5;
}

Assistant:

rtc::Optional<Point> GetNormalIfPlanar(
    const std::vector<Point>& array_geometry) {
  RTC_DCHECK_GT(array_geometry.size(), 1u);
  const Point first_pair_direction =
      PairDirection(array_geometry[0], array_geometry[1]);
  Point pair_direction(0.f, 0.f, 0.f);
  size_t i = 2u;
  bool is_linear = true;
  for (; i < array_geometry.size() && is_linear; ++i) {
    pair_direction = PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!AreParallel(first_pair_direction, pair_direction)) {
      is_linear = false;
    }
  }
  if (is_linear) {
    return rtc::Optional<Point>();
  }
  const Point normal_direction =
      CrossProduct(first_pair_direction, pair_direction);
  for (; i < array_geometry.size(); ++i) {
    pair_direction = PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!ArePerpendicular(normal_direction, pair_direction)) {
      return rtc::Optional<Point>();
    }
  }
  return rtc::Optional<Point>(normal_direction);
}